

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O3

LispPTR UFS_getfilename(LispPTR *args)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int *piVar7;
  size_t sVar8;
  DLword *pDVar9;
  LispPTR LVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  char lfname [4096];
  char file [4096];
  char local_2028 [4096];
  char local_1028 [4096];
  long lVar6;
  
  pcVar11 = local_2028;
  iVar4 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar4 != 0) {
    *Lisp_errno = 100;
    return 0;
  }
  uVar2 = args[3];
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  Lisp_errno = (int *)(Lisp_world + uVar2);
  uVar2 = *args;
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
    iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4) * 2;
LAB_00135ac5:
    if ((long)iVar4 - 0x1000U < 0xffffffffffffefff) {
      *Lisp_errno = 200;
      return 0;
    }
  }
  else {
    if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
      iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
      goto LAB_00135ac5;
    }
    error("LispStringLength: Not a character array.\n");
  }
  uVar2 = *args;
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  iVar4 = *(int *)(Lisp_world + (ulong)uVar2 + 4);
  iVar5 = 0x1000;
  if (iVar4 < 0x1000) {
    iVar5 = iVar4;
  }
  lVar6 = (long)iVar5;
  if ((char)Lisp_world[(ulong)uVar2 + 3] == 'D') {
    pcVar12 = local_2028;
    if (iVar4 != 0) {
      lVar6 = lVar6 + (ulong)(lVar6 == 0);
      pDVar9 = Lisp_world +
               (ulong)Lisp_world[(ulong)uVar2 + 2] +
               (ulong)(*(uint *)(Lisp_world + uVar2) & 0xfffffff);
      do {
        *pcVar11 = *(undefined1 *)((ulong)pDVar9 ^ 2);
        pcVar11 = pcVar11 + 1;
        pDVar9 = pDVar9 + 1;
        lVar6 = lVar6 + -1;
        pcVar12 = pcVar11;
      } while (lVar6 != 0);
    }
    *pcVar12 = 0;
  }
  else if ((char)Lisp_world[(ulong)uVar2 + 3] == 'C') {
    if (iVar4 != 0) {
      uVar3 = *(uint *)(Lisp_world + uVar2);
      uVar1 = Lisp_world[(ulong)uVar2 + 2];
      lVar13 = 0;
      do {
        local_2028[lVar13] =
             *(char *)((long)Lisp_world + lVar13 + (ulong)uVar1 + (ulong)(uVar3 & 0xfffffff) * 2 ^ 3
                      );
        lVar13 = lVar13 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar13);
    }
    local_2028[lVar6] = '\0';
  }
  else {
    error("LispStringToCString: Not a character array.\n");
  }
  iVar4 = unixpathname(local_2028,local_1028,0,0);
  if (iVar4 == 0) {
    return 0;
  }
  if ((args[1] & 0xfffffffe) == 0xe0000) {
    alarm(TIMEOUT_TIME);
    piVar7 = __errno_location();
    while( true ) {
      *piVar7 = 0;
      iVar4 = access(local_1028,0);
      if (iVar4 != -1) break;
      if (*piVar7 != 4) {
        alarm(0);
        *Lisp_errno = *piVar7;
        return 0;
      }
    }
    alarm(0);
  }
  lisppathname(local_1028,local_2028,0,0);
  uVar2 = args[2];
  if ((uVar2 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  sVar8 = strlen(local_2028);
  pDVar9 = Lisp_world;
  if (sVar8 == 0xffffffffffffffff) {
LAB_00135cff:
    LVar10 = (uint)sVar8 & 0xfffff;
  }
  else {
    uVar2 = *(uint *)(Lisp_world + uVar2);
    lVar6 = 0;
    do {
      *(char *)((long)pDVar9 + lVar6 + (ulong)(uVar2 & 0xfffffff) * 2 ^ 3) = local_2028[lVar6];
      lVar6 = lVar6 + 1;
    } while (sVar8 + 1 != lVar6);
    if ((long)sVar8 < 0) {
      if (0xfffffffffffeffff < sVar8) goto LAB_00135cff;
    }
    else if (sVar8 < 0x10000) {
      return (uint)sVar8 | 0xe0000;
    }
    error("Not Smallp data");
    LVar10 = 0xe0000;
  }
  return LVar10;
}

Assistant:

LispPTR UFS_getfilename(LispPTR *args)
{
  char *base;
  size_t len;
  int rval;
  char lfname[MAXPATHLEN], file[MAXPATHLEN];

  ERRSETJMP(NIL);
  Lisp_errno = (int *)(NativeAligned4FromLAddr(args[3]));

  LispStringLength(args[0], len, rval);
  len += 1; /* Add 1 for terminating NULL char. */
  if (len > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);
/*
 * Convert a Lisp file name to UNIX one.  This is a UNIX device method.
 * Thus we don't need to convert a version field.  Third argument for
 * unixpathname specifies it.
 */
#ifdef DOS
  if (unixpathname(lfname, file, 0, 0, 0, 0, 0) == 0) return (NIL);
#else
  if (unixpathname(lfname, file, 0, 0) == 0) return (NIL);
#endif /* DOS */

  switch (args[1]) {
    case RECOG_OLD:
    case RECOG_OLDEST:
      /*
       * "Old" and "Oldest" means the "existing" file.  All we have to do
       * is to make sure it is an existing file or not.
       */
      TIMEOUT(rval = access(file, F_OK));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      break;

    case RECOG_NEW:
    case RECOG_OLD_NEW:
    case RECOG_NON:
      /*
       * "New" file means the "not existing" file.  UNIX device always
       * recognizes a not existing file as if, the subsequent OPENFILE will
       * find the truth.
       * "Non" recognition is used to recognize a sysout file.
       */
      break;
  }
  /*
   * Now, we convert a file name back to Lisp format.  The version field have not
   * to be converted.  The fourth argument for lisppathname specifies it.
   */
  if (lisppathname(file, lfname, 0, 0) == 0) return (NIL);

  STRING_BASE(args[2], base);
  len = strlen(lfname);

#ifndef BYTESWAP
  strncpy(base, lfname, len + 1);
#else
  StrNCpyFromCToLisp(base, lfname, len + 1);
#endif /* BYTESWAP */

  return (GetSmallp(len));
}